

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.cpp
# Opt level: O2

void __thiscall spvtools::opt::SSAPropagator::AddControlEdge(SSAPropagator *this,Edge *edge)

{
  BasicBlock *pBVar1;
  CFG *pCVar2;
  pair<std::_Rb_tree_iterator<spvtools::opt::Edge>,_bool> pVar3;
  BasicBlock *dest_bb;
  BasicBlock *local_20;
  
  pBVar1 = edge->dest;
  local_20 = pBVar1;
  pCVar2 = IRContext::cfg(this->ctx_);
  if (pBVar1 != &pCVar2->pseudo_exit_block_) {
    pVar3 = std::
            _Rb_tree<spvtools::opt::Edge,spvtools::opt::Edge,std::_Identity<spvtools::opt::Edge>,std::less<spvtools::opt::Edge>,std::allocator<spvtools::opt::Edge>>
            ::_M_insert_unique<spvtools::opt::Edge_const&>
                      ((_Rb_tree<spvtools::opt::Edge,spvtools::opt::Edge,std::_Identity<spvtools::opt::Edge>,std::less<spvtools::opt::Edge>,std::allocator<spvtools::opt::Edge>>
                        *)&this->executable_edges_,edge);
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      std::deque<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
      push_back(&(this->blocks_).c,&local_20);
    }
  }
  return;
}

Assistant:

void SSAPropagator::AddControlEdge(const Edge& edge) {
  BasicBlock* dest_bb = edge.dest;

  // Refuse to add the exit block to the work list.
  if (dest_bb == ctx_->cfg()->pseudo_exit_block()) {
    return;
  }

  // Try to mark the edge executable.  If it was already in the set of
  // executable edges, do nothing.
  if (!MarkEdgeExecutable(edge)) {
    return;
  }

  // If the edge had not already been marked executable, add the destination
  // basic block to the work list.
  blocks_.push(dest_bb);
}